

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_utils.hpp
# Opt level: O3

void ELFIO::adjust_stream_size(ostream *stream,streamsize offset)

{
  char cVar1;
  long lVar2;
  long *local_48 [2];
  long local_38 [2];
  
  std::ostream::seekp((long)stream,_S_beg);
  lVar2 = std::ostream::tellp();
  if (lVar2 < offset) {
    cVar1 = std::ostream::tellp();
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct((ulong)local_48,(char)offset - cVar1);
    std::ostream::write((char *)stream,(long)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0],local_38[0] + 1);
    }
  }
  std::ostream::seekp(stream,offset,0);
  return;
}

Assistant:

inline void adjust_stream_size( std::ostream& stream, std::streamsize offset )
{
    stream.seekp( 0, std::ios_base::end );
    if ( stream.tellp() < offset ) {
        std::streamsize size = offset - stream.tellp();
        stream.write( std::string( size_t( size ), '\0' ).c_str(), size );
    }
    stream.seekp( offset );
}